

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consuming_buffers.hpp
# Opt level: O2

array<asio::const_buffer,_2UL> * __thiscall
asio::detail::
consuming_buffers<asio::const_buffer,_std::array<asio::const_buffer,_2UL>,_const_asio::const_buffer_*>
::prepare(array<asio::const_buffer,_2UL> *__return_storage_ptr__,
         consuming_buffers<asio::const_buffer,_std::array<asio::const_buffer,_2UL>,_const_asio::const_buffer_*>
         *this,size_t max_size)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  sVar2 = (this->buffers_)._M_elems[0].size_;
  __return_storage_ptr__->_M_elems[0].data_ = (this->buffers_)._M_elems[0].data_;
  __return_storage_ptr__->_M_elems[0].size_ = sVar2;
  sVar2 = (this->buffers_)._M_elems[1].size_;
  __return_storage_ptr__->_M_elems[1].data_ = (this->buffers_)._M_elems[1].data_;
  __return_storage_ptr__->_M_elems[1].size_ = sVar2;
  uVar1 = __return_storage_ptr__->_M_elems[0].size_;
  uVar3 = this->total_consumed_;
  uVar4 = uVar3;
  if (uVar1 < uVar3) {
    uVar4 = uVar1;
  }
  uVar5 = uVar1 - uVar4;
  if (max_size <= uVar1 - uVar4) {
    uVar5 = max_size;
  }
  __return_storage_ptr__->_M_elems[0].data_ =
       (void *)((long)__return_storage_ptr__->_M_elems[0].data_ + uVar4);
  __return_storage_ptr__->_M_elems[0].size_ = uVar5;
  uVar4 = 0;
  if (uVar1 <= uVar3) {
    uVar4 = uVar3 - uVar1;
  }
  uVar1 = __return_storage_ptr__->_M_elems[1].size_;
  if (uVar1 < uVar4) {
    uVar4 = uVar1;
  }
  uVar3 = max_size - uVar5;
  if (uVar1 - uVar4 < max_size - uVar5) {
    uVar3 = uVar1 - uVar4;
  }
  __return_storage_ptr__->_M_elems[1].data_ =
       (void *)((long)__return_storage_ptr__->_M_elems[1].data_ + uVar4);
  __return_storage_ptr__->_M_elems[1].size_ = uVar3;
  return __return_storage_ptr__;
}

Assistant:

std::array<Buffer, 2> prepare(std::size_t max_size)
  {
    std::array<Buffer, 2> result = {{
      Buffer(buffers_[0]), Buffer(buffers_[1]) }};
    std::size_t buffer0_size = result[0].size();
    result[0] = asio::buffer(result[0] + total_consumed_, max_size);
    result[1] = asio::buffer(
        result[1] + (total_consumed_ < buffer0_size
          ? 0 : total_consumed_ - buffer0_size),
        max_size - result[0].size());
    return result;
  }